

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

int AF_A_Overlay(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *pAVar2;
  player_t *this;
  PClass *pPVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar6;
  DPSprite *pDVar7;
  FState *newstate;
  char *pcVar8;
  AActor *caller;
  bool bVar9;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_0052f228;
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_0052f1bf:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0052f228:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x47b,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  pAVar2 = (AActor *)(param->field_0).field_1.a;
  if (pAVar2 != (AActor *)0x0) {
    if ((pAVar2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(pAVar2->super_DThinker).super_DObject._vptr_DObject)(pAVar2);
      (pAVar2->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
    }
    pPVar6 = (pAVar2->super_DThinker).super_DObject.Class;
    bVar9 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar3 && bVar9) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0052f228;
    }
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  caller = pAVar2;
  if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
    if ((VVar1 != '\x03') ||
       ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
    goto LAB_0052f1bf;
    caller = (AActor *)param[1].field_0.field_1.a;
    if (caller == (AActor *)0x0) {
      caller = (AActor *)0x0;
    }
    else {
      if ((caller->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(caller->super_DThinker).super_DObject._vptr_DObject)(caller);
        (caller->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
      }
      pPVar6 = (caller->super_DThinker).super_DObject.Class;
      bVar9 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar3 && bVar9) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar9 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (!bVar9) {
        pcVar8 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0052f228;
      }
    }
  }
  if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
     ((VVar1 != '\x03' ||
      ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
    goto LAB_0052f228;
  }
  if (numparam < 4) {
    pcVar8 = "(paramnum) < numparam";
LAB_0052f1e1:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x47c,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_0052f1e1;
  }
  iVar4 = param[3].field_0.i;
  if ((numparam == 4) || (VVar1 = param[4].field_0.field_3.Type, VVar1 == 0xff)) {
    newstate = (FState *)0x0;
  }
  else {
    if ((VVar1 != '\x03') ||
       ((param[4].field_0.field_1.atag != 7 && (param[4].field_0.field_1.a != (void *)0x0)))) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x47d,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    newstate = (FState *)param[4].field_0.field_1.a;
  }
  if (5 < numparam) {
    VVar1 = param[5].field_0.field_3.Type;
    if (VVar1 == '\0') {
      bVar9 = param[5].field_0.i != 0;
      goto LAB_0052f110;
    }
    if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x47e,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  bVar9 = false;
LAB_0052f110:
  this = pAVar2->player;
  if ((this == (player_t *)0x0) ||
     ((bVar9 && (pDVar7 = player_t::FindPSprite(this,iVar4), pDVar7 != (DPSprite *)0x0)))) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x484,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    uVar5 = 0;
  }
  else {
    pDVar7 = (DPSprite *)
             M_Malloc_Dbg(0x88,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                          ,0x1f7);
    DPSprite::DPSprite(pDVar7,this,caller,iVar4);
    DPSprite::SetState(pDVar7,newstate,false);
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x48a,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    uVar5 = 1;
  }
  if (ret->RegType == '\0') {
    *(undefined4 *)ret->Location = uVar5;
    return 1;
  }
  __assert_fail("RegType == REGT_INT",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vm.h"
                ,0x118,"void VMReturn::SetInt(int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_Overlay)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT		(layer);
	PARAM_STATE_OPT	(state) { state = nullptr; }
	PARAM_BOOL_OPT	(dontoverride)	{ dontoverride = false; }

	player_t *player = self->player;

	if (player == nullptr || (dontoverride && (player->FindPSprite(layer) != nullptr)))
	{
		ACTION_RETURN_BOOL(false);
	}

	DPSprite *pspr;
	pspr = new DPSprite(player, stateowner, layer);
	pspr->SetState(state);
	ACTION_RETURN_BOOL(true);
}